

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void AdditionHelper<char,_unsigned_long,_14>::
     AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (char *lhs,unsigned_long *rhs,char *result)

{
  int u;
  undefined8 *in_RSI;
  char *in_RDI;
  uint32_t tmp;
  char *in_stack_ffffffffffffffd8;
  
  if (((int)((ulong)*in_RSI >> 0x20) == 0) && (u = (int)*in_RSI + (int)*in_RDI, *in_RDI <= u)) {
    SafeCastHelper<char,_int,_4>::CastThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              (u,in_stack_ffffffffffffffd8);
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // rhs is std::uint64_t, lhs signed, 32-bit or less

        if( (std::uint32_t)( rhs >> 32 ) == 0 )
        {
            // Now it just happens to work out that the standard behavior does what we want
            // Adding explicit casts to show exactly what's happening here
            std::uint32_t tmp = (std::uint32_t)rhs + (std::uint32_t)lhs;

            if( (std::int32_t)tmp >= lhs )
            {
                SafeCastHelper< T, std::int32_t, GetCastMethod< T, std::int32_t >::method >::template CastThrow< E >( (std::int32_t)tmp, result );
                return;
            }
        }
        E::SafeIntOnOverflow();
    }